

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<tinyusdz::value::half,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<tinyusdz::value::half,2ul>>
          (optional<std::array<tinyusdz::value::half,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  get_value<std::array<tinyusdz::value::half,2ul>>
            ((optional<std::array<tinyusdz::value::half,_2UL>_> *)((long)&uStack_18 + 2),this);
  __return_storage_ptr__->has_value_ = uStack_18._2_1_;
  if (uStack_18._2_1_ == true) {
    __return_storage_ptr__->contained = uStack_18._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }